

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

void __thiscall OpenMD::EAM::EAM(EAM *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__EAM_002ac9d0;
  this->initialized_ = false;
  this->haveCutoffRadius_ = false;
  p_Var1 = &(this->EAMtypes)._M_t._M_impl.super__Rb_tree_header;
  (this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->EAMdata).super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EAMdata).super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EAMdata).super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->forceField_ = (ForceField *)0x0;
  this->electrostatic_ = (Electrostatic *)0x0;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mixMeth_ = eamJohnson;
  (this->rhat).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->rhat).super_Vector<double,_3U>.data_[2] = 0.0;
  this->eamRcut_ = 0.0;
  (this->rhat).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name_,"EAM","");
  this->pre11_ = 332.0637778;
  return;
}

Assistant:

EAM::EAM() :
      initialized_(false), haveCutoffRadius_(false), forceField_(NULL),
      electrostatic_(NULL), eamRcut_(0.0), mixMeth_(eamJohnson), name_("EAM") {
    // This prefactor converts charge-charge interactions into kcal /
    // mol assuming distances are measured in angstroms and charges
    // are measured in electrons. Matches the value in
    // Electrostatics.cpp
    pre11_ = 332.0637778;
  }